

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpg.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ostream *poVar7;
  size_t sVar8;
  char *pcVar9;
  char **__n;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  string *input_stream;
  long lVar13;
  int num_order;
  int num_past_frame;
  InputSourceFromStream input_source;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  window_coefficients;
  vector<double,_std::allocator<double>_> coefficients_3;
  vector<double,_std::allocator<double>_> smoothed_static_parameters;
  double magic_number;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  smoothed_static_parameters_1;
  vector<double,_std::allocator<double>_> coefficients;
  InputSourcePreprocessing preprocessed_source;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  variance_vectors;
  ifstream ifs;
  option long_options [2];
  undefined1 auStack_648 [4];
  int local_644;
  int local_640;
  allocator local_63a;
  allocator local_639;
  string local_638;
  char **local_618;
  ulong local_610;
  int local_604;
  ulong local_600;
  InputSourceFromStream local_5f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_5d8;
  string local_5b8 [3];
  ios_base local_548 [272];
  vector<double,_std::allocator<double>_> local_438;
  ulong local_418;
  double local_410;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_408;
  undefined1 local_3e8 [8];
  double *pdStack_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8 [2];
  bool local_3b8;
  bool local_3b0;
  InputSourceInterface local_2f8;
  int local_2f0;
  int local_2ec;
  InputSourceFromStream *local_2e8;
  undefined1 local_2e0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2d8;
  string local_2c0;
  uint auStack_2a0 [20];
  ios_base local_250 [408];
  string local_b8;
  string local_98;
  option local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_644 = 0x19;
  local_640 = 0x1e;
  local_5d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418 = 0;
  local_410 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.flag = (int *)0x0;
  local_78.val = 1000;
  local_78._28_4_ = 0;
  local_78.name = "magic";
  local_78.has_arg = 1;
  local_78._12_4_ = 0;
  local_600 = 0;
  local_610 = 0;
  local_604 = 0;
  iVar11 = 0;
  local_618 = argv;
  do {
    iVar5 = ya_getopt_long_only(argc,local_618,"l:m:s:q:d:D:r:R:h",&local_78,(int *)0x0);
    if (iVar5 < 100) {
      if (iVar5 == -1) {
        iVar5 = 2;
      }
      else {
        if (iVar5 != 0x44) {
          if (iVar5 != 0x52) goto switchD_00103a1e_caseD_1;
          std::__cxx11::string::string((string *)&local_2c0,ya_optarg,(allocator *)local_5b8);
          bVar2 = sptk::ConvertStringToInteger(&local_2c0,(int *)local_3e8);
          if (bVar2) {
            bVar2 = sptk::IsInRange(local_3e8._0_4_,0,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p);
            }
            if (bVar2) {
              iVar5 = 4;
              bVar2 = true;
              local_418 = (ulong)local_3e8 & 0xffffffff;
              goto LAB_0010424d;
            }
          }
          else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2c0,"The argument for the -R option must be an integer ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2c0,"in the range of ",0x10);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
          std::ostream::operator<<((ostream *)poVar7,1);
          local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
          sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
          goto LAB_0010420a;
        }
        if ((local_610 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2c0,"-D and -r options cannot be specified at the same time",
                     0x36);
          local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
          sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
          goto LAB_001042aa;
        }
        std::ifstream::ifstream(&local_2c0);
        std::ifstream::open((char *)&local_2c0,(_Ios_Openmode)ya_optarg);
        uVar12 = *(uint *)((long)auStack_2a0 + *(long *)(local_2c0._M_dataplus._M_p + -0x18));
        if ((uVar12 & 5) == 0) {
          local_5b8[0]._M_dataplus._M_p = (pointer)0x0;
          local_5b8[0]._M_string_length = 0;
          local_5b8[0].field_2._M_allocated_capacity = (double *)0x0;
          while (bVar2 = sptk::ReadStream<double>((double *)local_3e8,(istream *)&local_2c0), bVar2)
          {
            if (local_5b8[0]._M_string_length == local_5b8[0].field_2._M_allocated_capacity) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)local_5b8,
                         (iterator)local_5b8[0]._M_string_length,(double *)local_3e8);
            }
            else {
              *(undefined1 (*) [8])local_5b8[0]._M_string_length = local_3e8;
              local_5b8[0]._M_string_length = local_5b8[0]._M_string_length + 8;
            }
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&local_5d8,(value_type *)local_5b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8[0]._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_5b8[0]._M_dataplus._M_p);
          }
          iVar5 = 4;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b8,"Cannot open file ",0x11);
          pcVar9 = ya_optarg;
          if (ya_optarg == (char *)0x0) {
            std::ios::clear((int)auStack_648 +
                            (int)*(undefined8 *)(local_5b8[0]._M_dataplus._M_p + -0x18) + 0x90);
          }
          else {
            sVar8 = strlen(ya_optarg);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,pcVar9,sVar8);
          }
          local_3e8 = (undefined1  [8])local_3d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"mlpg","");
          sptk::PrintErrorMessage((string *)local_3e8,(ostringstream *)local_5b8);
          if (local_3e8 != (undefined1  [8])local_3d8) {
            operator_delete((void *)local_3e8);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
          std::ios_base::~ios_base(local_548);
          iVar5 = 1;
          iVar11 = 1;
        }
        std::ifstream::~ifstream(&local_2c0);
        if ((uVar12 & 5) == 0) goto LAB_00104255;
      }
      goto LAB_001042eb;
    }
    uVar10 = (ulong)(iVar5 - 100);
    switch(uVar10) {
    case 0:
      if ((local_610 & 1) == 0) {
        local_3e8 = (undefined1  [8])0x0;
        pdStack_3e0 = (double *)0x0;
        local_3d8[0]._M_allocated_capacity = (double *)0x0;
        std::__cxx11::string::string((string *)&local_2c0,ya_optarg,(allocator *)local_5b8);
        bVar2 = sptk::ConvertStringToDouble(&local_2c0,(double *)&local_5f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if (bVar2) {
          if (pdStack_3e0 == (double *)local_3d8[0]._0_8_) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)local_3e8,(iterator)pdStack_3e0,
                       (double *)&local_5f8);
          }
          else {
            *pdStack_3e0 = (double)CONCAT44(local_5f8.super_InputSourceInterface.
                                            _vptr_InputSourceInterface._4_4_,
                                            (int)local_5f8.super_InputSourceInterface.
                                                 _vptr_InputSourceInterface);
            pdStack_3e0 = pdStack_3e0 + 1;
          }
          while( true ) {
            if (ya_optind < argc) {
              std::__cxx11::string::string((string *)&local_98,local_618[ya_optind],&local_639);
              bVar4 = sptk::ConvertStringToDouble(&local_98,(double *)&local_5f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p);
              }
            }
            else {
              bVar4 = false;
            }
            if (bVar4 == false) break;
            if (pdStack_3e0 == (double *)local_3d8[0]._0_8_) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)local_3e8,(iterator)pdStack_3e0,
                         (double *)&local_5f8);
            }
            else {
              *pdStack_3e0 = (double)CONCAT44(local_5f8.super_InputSourceInterface.
                                              _vptr_InputSourceInterface._4_4_,
                                              (int)local_5f8.super_InputSourceInterface.
                                                   _vptr_InputSourceInterface);
              pdStack_3e0 = pdStack_3e0 + 1;
            }
            ya_optind = ya_optind + 1;
          }
          iVar5 = 4;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&local_5d8,(value_type *)local_3e8);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2c0,"The argument for the -d option must be numeric",0x2e);
          local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
          sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
            operator_delete(local_5b8[0]._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
          std::ios_base::~ios_base(local_250);
          iVar5 = 1;
          iVar11 = 1;
        }
        if (local_3e8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3e8);
        }
        if (bVar2) goto LAB_00104255;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,"-d and -r options cannot be specified at the same time",
                   0x36);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
LAB_001042aa:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
          operator_delete(local_5b8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
        std::ios_base::~ios_base(local_250);
        iVar5 = 1;
        iVar11 = 1;
      }
      break;
    case 1:
    case 2:
    case 3:
    case 5:
    case 6:
    case 7:
    case 10:
    case 0xb:
    case 0xc:
switchD_00103a1e_caseD_1:
      iVar5 = 1;
      anon_unknown.dwarf_4023::PrintUsage((ostream *)&std::cerr);
      iVar11 = 1;
      break;
    case 4:
      anon_unknown.dwarf_4023::PrintUsage((ostream *)&std::cout);
      iVar11 = 0;
      iVar5 = 1;
      break;
    case 8:
      std::__cxx11::string::string((string *)&local_2c0,ya_optarg,(allocator *)local_5b8);
      bVar4 = sptk::ConvertStringToInteger(&local_2c0,&local_644);
      bVar2 = local_644 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      if (!bVar4 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
        goto LAB_001042aa;
      }
      local_644 = local_644 + -1;
      goto LAB_00104255;
    case 9:
      std::__cxx11::string::string((string *)&local_2c0,ya_optarg,(allocator *)local_5b8);
      bVar2 = sptk::ConvertStringToInteger(&local_2c0,&local_644);
      bVar4 = local_644 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      if (!bVar2 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,"non-negative integer",0x14);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
        goto LAB_001042aa;
      }
      goto LAB_00104255;
    case 0xd:
      std::__cxx11::string::string((string *)&local_2c0,ya_optarg,(allocator *)local_5b8);
      bVar2 = sptk::ConvertStringToInteger(&local_2c0,(int *)local_3e8);
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3e8._0_4_,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if (bVar2) {
          iVar5 = 4;
          bVar2 = true;
          local_604 = local_3e8._0_4_;
          goto LAB_0010424d;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2c0,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2c0,"in the range of ",0x10);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_2c0,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
      std::ostream::operator<<((ostream *)poVar7,2);
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
LAB_0010420a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
        operator_delete(local_5b8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
      std::ios_base::~ios_base(local_250);
      iVar5 = 1;
      bVar2 = false;
      iVar11 = 1;
      goto LAB_0010424d;
    case 0xe:
      if ((local_610 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,"-r option cannot be specified multiple times",0x2c);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
        goto LAB_001042aa;
      }
      local_3e8 = (undefined1  [8])0x0;
      pdStack_3e0 = (double *)0x0;
      local_3d8[0]._M_allocated_capacity = (double *)0x0;
      std::__cxx11::string::string((string *)&local_2c0,ya_optarg,(allocator *)local_5b8);
      bVar2 = sptk::ConvertStringToInteger(&local_2c0,(int *)&local_5f8);
      if (bVar2) {
        bVar2 = sptk::ComputeFirstOrderRegressionCoefficients
                          ((int)local_5f8.super_InputSourceInterface._vptr_InputSourceInterface,
                           (vector<double,_std::allocator<double>_> *)local_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if (!bVar2) goto LAB_00104313;
        bVar2 = true;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&local_5d8,(value_type *)local_3e8);
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
LAB_00104313:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,
                   "The argument for the -r option must be positive integer(s)",0x3a);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
          operator_delete(local_5b8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
        std::ios_base::~ios_base(local_250);
        iVar11 = 1;
        bVar2 = false;
      }
      if (local_3e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_3e8);
      }
      iVar1 = ya_optind;
      iVar5 = 1;
      if (bVar2) {
        if (ya_optind < argc) {
          std::__cxx11::string::string((string *)&local_b8,local_618[ya_optind],&local_63a);
          bVar2 = sptk::ConvertStringToInteger(&local_b8,(int *)&local_5f8);
        }
        else {
          bVar2 = false;
        }
        if ((iVar1 < argc) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (bVar2 != false) {
          local_3e8 = (undefined1  [8])0x0;
          pdStack_3e0 = (double *)0x0;
          local_3d8[0]._M_allocated_capacity = (double *)0x0;
          bVar2 = sptk::ComputeSecondOrderRegressionCoefficients
                            ((int)local_5f8.super_InputSourceInterface._vptr_InputSourceInterface,
                             (vector<double,_std::allocator<double>_> *)local_3e8);
          if (bVar2) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back(&local_5d8,(value_type *)local_3e8);
            ya_optind = ya_optind + 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2c0,
                       "The argument for the -r option must be positive integer(s)",0x3a);
            local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
            sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
              operator_delete(local_5b8[0]._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
            std::ios_base::~ios_base(local_250);
            iVar11 = 1;
          }
          if (local_3e8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_3e8);
          }
          if (!bVar2) goto LAB_0010481d;
        }
        bVar2 = true;
        iVar5 = 4;
        local_610 = CONCAT71((int7)(uVar10 >> 8),1);
      }
      else {
LAB_0010481d:
        bVar2 = false;
      }
LAB_0010424d:
      if (bVar2) goto LAB_00104255;
      break;
    case 0xf:
      std::__cxx11::string::string((string *)&local_2c0,ya_optarg,(allocator *)local_5b8);
      bVar2 = sptk::ConvertStringToInteger(&local_2c0,&local_640);
      bVar4 = local_640 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      if (!bVar2 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,"The argument for the -s option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,"non-negative integer",0x14);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
        goto LAB_001042aa;
      }
      goto LAB_00104255;
    default:
      if (iVar5 != 1000) goto switchD_00103a1e_caseD_1;
      std::__cxx11::string::string((string *)&local_2c0,ya_optarg,(allocator *)local_5b8);
      bVar2 = sptk::ConvertStringToDouble(&local_2c0,&local_410);
      paVar6 = &local_2c0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar6) {
        operator_delete(local_2c0._M_dataplus._M_p);
        paVar6 = extraout_RAX;
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2c0,"The argument for the -magic option must be a number",0x33)
        ;
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
        goto LAB_001042aa;
      }
      local_600 = CONCAT71((int7)((ulong)paVar6 >> 8),1);
LAB_00104255:
      iVar5 = 0;
    }
LAB_001042eb:
  } while (iVar5 == 0);
  if (iVar5 != 2) goto LAB_0010516f;
  if (argc - ya_optind < 2) {
    if (argc == ya_optind) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = local_618[ya_optind];
    }
    bVar2 = sptk::SetBinaryMode();
    if (bVar2) {
      input_stream = &local_2c0;
      std::ifstream::ifstream(input_stream);
      if ((pcVar9 == (char *)0x0) ||
         (std::ifstream::open((char *)&local_2c0,(_Ios_Openmode)pcVar9),
         (*(byte *)((long)auStack_2a0 + *(long *)(local_2c0._M_dataplus._M_p + -0x18)) & 5) == 0)) {
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          input_stream = (string *)&std::cin;
        }
        __n = (char **)((long)local_644 + 1);
        sptk::InputSourceFromStream::InputSourceFromStream
                  (&local_5f8,false,
                   ((int)((ulong)((long)local_5d8.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_5d8.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x55555555 + 1) * (int)__n * 2,(istream *)input_stream);
        local_2f8._vptr_InputSourceInterface = (_func_int **)&PTR__InputSourceInterface_00119ad0;
        local_2f0 = local_604;
        local_2ec = (**(code **)(CONCAT44(local_5f8.super_InputSourceInterface.
                                          _vptr_InputSourceInterface._4_4_,
                                          (int)local_5f8.super_InputSourceInterface.
                                               _vptr_InputSourceInterface) + 0x10))(&local_5f8);
        local_2ec = local_2ec / 2;
        local_2e0 = 1;
        local_2e8 = &local_5f8;
        cVar3 = (**(code **)(CONCAT44(local_5f8.super_InputSourceInterface.
                                      _vptr_InputSourceInterface._4_4_,
                                      (int)local_5f8.super_InputSourceInterface.
                                           _vptr_InputSourceInterface) + 0x18))(&local_5f8);
        if (cVar3 == '\0') {
          local_2e0 = 0;
        }
        if ((int)local_418 == 1) {
          sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
          NonrecursiveMaximumLikelihoodParameterGeneration
                    ((NonrecursiveMaximumLikelihoodParameterGeneration *)local_3e8,local_644,
                     &local_5d8,(bool)((byte)local_600 & 1),local_410);
          if (local_3b0 == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"Failed to initialize ",0x15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"NonrecursiveMaximumLikelihoodParameterGeneration",0x30)
            ;
            local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"mlpg","");
            sptk::PrintErrorMessage(&local_638,(ostringstream *)local_5b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_638._M_dataplus._M_p != &local_638.field_2) {
              operator_delete(local_638._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
            std::ios_base::~ios_base(local_548);
            iVar11 = 1;
            bVar2 = false;
          }
          else {
            local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2d8.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2d8.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2d8.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_5b8[0].field_2._M_allocated_capacity = (double *)0x0;
            local_5b8[0]._M_dataplus._M_p = (pointer)0x0;
            local_5b8[0]._M_string_length = 0;
            local_618 = __n;
            while (bVar2 = sptk::InputSourceFromStream::Get
                                     (&local_5f8,
                                      (vector<double,_std::allocator<double>_> *)local_5b8), bVar2)
            {
              std::vector<double,std::allocator<double>>::
              vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                        ((vector<double,std::allocator<double>> *)&local_638,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )local_5b8[0]._M_dataplus._M_p,
                         (double *)
                         ((long)local_5b8[0]._M_dataplus._M_p + (long)(local_5f8.read_size_ / 2) * 8
                         ),(allocator_type *)&local_408);
              std::
              vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              ::emplace_back<std::vector<double,std::allocator<double>>>
                        ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                          *)&local_438,(vector<double,_std::allocator<double>_> *)&local_638);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_638._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_638._M_dataplus._M_p);
              }
              std::vector<double,std::allocator<double>>::
              vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                        ((vector<double,std::allocator<double>> *)&local_638,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )(local_5b8[0]._M_dataplus._M_p + (long)(local_5f8.read_size_ / 2) * 8),
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )local_5b8[0]._M_string_length,(allocator_type *)&local_408);
              std::
              vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              ::emplace_back<std::vector<double,std::allocator<double>>>
                        ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                          *)&local_2d8,(vector<double,_std::allocator<double>_> *)&local_638);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_638._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_638._M_dataplus._M_p);
              }
            }
            if ((double *)local_5b8[0]._M_dataplus._M_p != (double *)0x0) {
              operator_delete(local_5b8[0]._M_dataplus._M_p);
            }
            local_408.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_408.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_408.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar2 = sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
                              ((NonrecursiveMaximumLikelihoodParameterGeneration *)local_3e8,
                               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&local_438,&local_2d8,&local_408);
            if (bVar2) {
              uVar12 = (int)((long)local_408.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_408.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
              bVar2 = (int)uVar12 < 1;
              if (0 < (int)uVar12) {
                lVar13 = 0;
                uVar10 = 0;
                do {
                  bVar2 = sptk::WriteStream<double>
                                    (0,(int)local_618,
                                     (vector<double,_std::allocator<double>_> *)
                                     ((long)&((local_408.
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data._M_start + lVar13),
                                     (ostream *)&std::cout,(int *)0x0);
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_5b8,"Failed to write static parameters",0x21);
                    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"mlpg","");
                    sptk::PrintErrorMessage(&local_638,(ostringstream *)local_5b8);
                    goto LAB_001050e4;
                  }
                  uVar10 = uVar10 + 1;
                  lVar13 = lVar13 + 0x18;
                } while ((uVar12 & 0x7fffffff) != uVar10);
                bVar2 = (uVar12 & 0x7fffffff) <= uVar10;
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5b8,"Failed to perform MLPG",0x16);
              local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"mlpg","");
              sptk::PrintErrorMessage(&local_638,(ostringstream *)local_5b8);
LAB_001050e4:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_638._M_dataplus._M_p != &local_638.field_2) {
                operator_delete(local_638._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
              std::ios_base::~ios_base(local_548);
              iVar11 = 1;
              bVar2 = false;
            }
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_408);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_2d8);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&local_438);
          }
          local_3e8 = (undefined1  [8])
                      &PTR__NonrecursiveMaximumLikelihoodParameterGeneration_00119b30;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)local_3d8);
joined_r0x0010515d:
          if (!bVar2) goto LAB_00105162;
        }
        else if ((int)local_418 == 0) {
          if ((local_600 & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"Magic number is not supported on recursive mode",0x2f);
            local_3e8 = (undefined1  [8])local_3d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"mlpg","");
            sptk::PrintErrorMessage((string *)local_3e8,(ostringstream *)local_5b8);
            goto LAB_00104b6b;
          }
          sptk::RecursiveMaximumLikelihoodParameterGeneration::
          RecursiveMaximumLikelihoodParameterGeneration
                    ((RecursiveMaximumLikelihoodParameterGeneration *)local_3e8,local_644,local_640,
                     &local_5d8,&local_2f8);
          if (local_3b8 == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,
                       "Failed to initialize RecursiveMaximumLikelihoodParameterGeneration",0x42);
            local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"mlpg","");
            sptk::PrintErrorMessage(&local_638,(ostringstream *)local_5b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_638._M_dataplus._M_p != &local_638.field_2) {
              operator_delete(local_638._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
            std::ios_base::~ios_base(local_548);
            iVar11 = 1;
            bVar2 = false;
          }
          else {
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_438,(size_type)__n,(allocator_type *)local_5b8);
            do {
              bVar2 = sptk::RecursiveMaximumLikelihoodParameterGeneration::Get
                                ((RecursiveMaximumLikelihoodParameterGeneration *)local_3e8,
                                 &local_438);
              if (!bVar2) goto LAB_00104df2;
              bVar4 = sptk::WriteStream<double>
                                (0,(int)__n,&local_438,(ostream *)&std::cout,(int *)0x0);
            } while (bVar4);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"Failed to write static parameters",0x21);
            local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"mlpg","");
            sptk::PrintErrorMessage(&local_638,(ostringstream *)local_5b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_638._M_dataplus._M_p != &local_638.field_2) {
              operator_delete(local_638._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
            std::ios_base::~ios_base(local_548);
            iVar11 = 1;
LAB_00104df2:
            if (local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            bVar2 = !bVar2;
          }
          sptk::RecursiveMaximumLikelihoodParameterGeneration::
          ~RecursiveMaximumLikelihoodParameterGeneration
                    ((RecursiveMaximumLikelihoodParameterGeneration *)local_3e8);
          goto joined_r0x0010515d;
        }
        iVar11 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5b8,"Cannot open file ",0x11);
        sVar8 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,pcVar9,sVar8);
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"mlpg","");
        sptk::PrintErrorMessage((string *)local_3e8,(ostringstream *)local_5b8);
LAB_00104b6b:
        if (local_3e8 != (undefined1  [8])local_3d8) {
          operator_delete((void *)local_3e8);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
        std::ios_base::~ios_base(local_548);
        iVar11 = 1;
      }
LAB_00105162:
      std::ifstream::~ifstream(&local_2c0);
      goto LAB_0010516f;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Cannot set translation mode",0x1b);
    local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
    sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Too many input files",0x14);
    local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
    sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
    operator_delete(local_5b8[0]._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
  std::ios_base::~ios_base(local_250);
  iVar11 = 1;
LAB_0010516f:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_5d8);
  return iVar11;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int num_past_frame(kDefaultNumPastFrame);
  InputFormats input_format(kDefaultInputFormat);
  std::vector<std::vector<double> > window_coefficients;
  bool is_regression_specified(false);
  double magic_number(0.0);
  bool is_magic_number_specified(false);
  Modes mode(kDefaultMode);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:s:q:d:D:r:R:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &num_past_frame) ||
            num_past_frame < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'd': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-d and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        std::vector<double> coefficients;
        double coefficient;
        if (!sptk::ConvertStringToDouble(optarg, &coefficient)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be numeric";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        coefficients.push_back(coefficient);
        while (optind < argc &&
               sptk::ConvertStringToDouble(argv[optind], &coefficient)) {
          coefficients.push_back(coefficient);
          ++optind;
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'D': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-D and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        std::ifstream ifs;
        ifs.open(optarg, std::ios::in | std::ios::binary);
        if (ifs.fail()) {
          std::ostringstream error_message;
          error_message << "Cannot open file " << optarg;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        std::vector<double> coefficients;
        double coefficient;
        while (sptk::ReadStream(&coefficient, &ifs)) {
          coefficients.push_back(coefficient);
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'r': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message << "-r option cannot be specified multiple times";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        int n;
        // Set first order coefficients.
        {
          std::vector<double> coefficients;
          if (!sptk::ConvertStringToInteger(optarg, &n) ||
              !sptk::ComputeFirstOrderRegressionCoefficients(n,
                                                             &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("mlpg", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
        }

        // Set second order coefficients.
        if (optind < argc && sptk::ConvertStringToInteger(argv[optind], &n)) {
          std::vector<double> coefficients;
          if (!sptk::ComputeSecondOrderRegressionCoefficients(n,
                                                              &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("mlpg", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
          ++optind;
        }
        is_regression_specified = true;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'R': {
        const int min(0);
        const int max(static_cast<int>(kNumModes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -R option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        mode = static_cast<Modes>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mlpg", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mlpg", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int static_size(num_order + 1);
  const int read_size(2 * static_size *
                      static_cast<int>(window_coefficients.size() + 1));
  sptk::InputSourceFromStream input_source(false, read_size, &input_stream);
  InputSourcePreprocessing preprocessed_source(input_format, &input_source);

  if (kRecursive == mode) {
    if (is_magic_number_specified) {
      std::ostringstream error_message;
      error_message << "Magic number is not supported on recursive mode";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    sptk::RecursiveMaximumLikelihoodParameterGeneration generation(
        num_order, num_past_frame, window_coefficients, &preprocessed_source);
    if (!generation.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize "
                       "RecursiveMaximumLikelihoodParameterGeneration";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    std::vector<double> smoothed_static_parameters(static_size);
    while (generation.Get(&smoothed_static_parameters)) {
      if (!sptk::WriteStream(0, static_size, smoothed_static_parameters,
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write static parameters";
        sptk::PrintErrorMessage("mlpg", error_message);
        return 1;
      }
    }
  } else if (kNonrecursive == mode) {
    sptk::NonrecursiveMaximumLikelihoodParameterGeneration generation(
        num_order, window_coefficients, is_magic_number_specified,
        magic_number);
    if (!generation.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize "
                    << "NonrecursiveMaximumLikelihoodParameterGeneration";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    std::vector<std::vector<double> > mean_vectors;
    std::vector<std::vector<double> > variance_vectors;
    {
      const int size(input_source.GetSize() / 2);
      std::vector<double> tmp;
      while (input_source.Get(&tmp)) {
        mean_vectors.push_back(
            std::vector<double>(tmp.begin(), tmp.begin() + size));
        variance_vectors.push_back(
            std::vector<double>(tmp.begin() + size, tmp.end()));
      }
    }

    std::vector<std::vector<double> > smoothed_static_parameters;
    if (!generation.Run(mean_vectors, variance_vectors,
                        &smoothed_static_parameters)) {
      std::ostringstream error_message;
      error_message << "Failed to perform MLPG";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    const int sequence_length(
        static_cast<int>(smoothed_static_parameters.size()));
    for (int t(0); t < sequence_length; ++t) {
      if (!sptk::WriteStream(0, static_size, smoothed_static_parameters[t],
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write static parameters";
        sptk::PrintErrorMessage("mlpg", error_message);
        return 1;
      }
    }
  }

  return 0;
}